

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorStatus.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorStatus::Mode5InterrogatorStatus
          (Mode5InterrogatorStatus *this,KUINT8 IFFMission,Mode5MessageFormat MF,KBOOL OnOffStatus,
          KBOOL Damaged,KBOOL Malfunction)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5InterrogatorStatus_00225f68;
  (this->m_StatusUnion).m_ui8Status =
       Malfunction << 7 | Damaged << 6 | OnOffStatus << 5 | IFFMission & 7 | ((byte)MF & 1) << 3;
  return;
}

Assistant:

Mode5InterrogatorStatus::Mode5InterrogatorStatus( KUINT8 IFFMission, KDIS::DATA_TYPE::ENUMS::Mode5MessageFormat MF, 
                                                  KBOOL OnOffStatus, KBOOL Damaged, KBOOL Malfunction )
{
	m_StatusUnion.m_ui8Status = 0; // Set all fields to 0
	m_StatusUnion.m_ui8IffMis = IFFMission;
	m_StatusUnion.m_ui8MsgFrmt = MF;
	m_StatusUnion.m_ui8OnOff = OnOffStatus;
	m_StatusUnion.m_ui8Dmg = Damaged;
	m_StatusUnion.m_ui8MalFnc = Malfunction;
}